

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintSExpression::printDebugLocation
          (PrintSExpression *this,optional<wasm::Function::DebugLocation> *location)

{
  bool bVar1;
  uint uVar2;
  pointer pbVar3;
  pointer pcVar4;
  BinaryLocation BVar5;
  BinaryLocation BVar6;
  undefined4 uVar7;
  ostream *poVar8;
  bool bVar9;
  size_type *local_68;
  value_type symbolName;
  value_type fileName;
  
  if (this->minify == false) {
    bVar1 = (this->lastPrintedLocation).
            super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged;
    bVar9 = bVar1 == (location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                     _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                     _M_engaged;
    if ((bVar1 & bVar9) == 1) {
      bVar9 = Function::DebugLocation::operator==
                        ((DebugLocation *)&this->lastPrintedLocation,(DebugLocation *)location);
    }
    if (((bVar9 == false) || (this->indent <= this->lastPrintIndent)) || (this->full == true)) {
      *(undefined8 *)
       ((long)&(this->lastPrintedLocation).
               super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
               symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4) =
           *(undefined8 *)
            ((long)&(location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                    _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                    _M_payload._M_value.symbolNameIndex.
                    super__Optional_base<unsigned_int,_true,_true>._M_payload + 4);
      BVar5 = (location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload
              .super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
              lineNumber;
      BVar6 = (location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload
              .super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
              columnNumber;
      uVar7 = (location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload
              .super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
              symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload;
      (this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
      fileIndex = (location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                  _M_value.fileIndex;
      (this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
      lineNumber = BVar5;
      (this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
      columnNumber = BVar6;
      *(undefined4 *)
       &(this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
        symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload = uVar7;
      this->lastPrintIndent = this->indent;
      if ((location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == false) {
        std::__ostream_insert<char,std::char_traits<char>>(this->o,";;@\n",4);
      }
      else {
        uVar2 = (location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                _M_value.fileIndex;
        pbVar3 = (this->currModule->debugInfoFileNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar4 = pbVar3[uVar2]._M_dataplus._M_p;
        symbolName.field_2._8_8_ = &fileName._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&symbolName.field_2 + 8),pcVar4,
                   pcVar4 + pbVar3[uVar2]._M_string_length);
        poVar8 = this->o;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";;@ ",4);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)symbolName.field_2._8_8_,(long)fileName._M_dataplus._M_p)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        if (*(char *)((long)&(location->
                             super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                             _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                             _M_payload + 0x10) == '\x01') {
          uVar2 = *(uint *)&(location->
                            super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                            _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                            _M_payload._M_value.symbolNameIndex.
                            super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int>;
          pbVar3 = (this->currModule->debugInfoSymbolNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar4 = pbVar3[uVar2]._M_dataplus._M_p;
          local_68 = &symbolName._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar4,pcVar4 + pbVar3[uVar2]._M_string_length);
          poVar8 = this->o;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,(char *)local_68,(long)symbolName._M_dataplus._M_p);
          if (local_68 != &symbolName._M_string_length) {
            operator_delete(local_68,symbolName._M_string_length + 1);
          }
        }
        local_68 = (size_type *)CONCAT71(local_68._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_68,1);
        if ((size_type *)symbolName.field_2._8_8_ != &fileName._M_string_length) {
          operator_delete((void *)symbolName.field_2._8_8_,fileName._M_string_length + 1);
        }
      }
      poVar8 = this->o;
      symbolName.field_2._8_8_ = &fileName._M_string_length;
      std::__cxx11::string::_M_construct((ulong)((long)&symbolName.field_2 + 8),(char)this->indent);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)symbolName.field_2._8_8_,(long)fileName._M_dataplus._M_p);
      if ((size_type *)symbolName.field_2._8_8_ != &fileName._M_string_length) {
        operator_delete((void *)symbolName.field_2._8_8_,fileName._M_string_length + 1);
      }
    }
  }
  return;
}

Assistant:

void PrintSExpression::printDebugLocation(
  const std::optional<Function::DebugLocation>& location) {
  if (minify) {
    return;
  }
  // Do not skip repeated debug info in full mode, for less-confusing debugging:
  // full mode prints out everything in the most verbose manner.
  if (lastPrintedLocation == location && indent > lastPrintIndent && !full) {
    return;
  }
  lastPrintedLocation = location;
  lastPrintIndent = indent;
  if (!location) {
    o << ";;@\n";
  } else {
    auto fileName = currModule->debugInfoFileNames[location->fileIndex];
    o << ";;@ " << fileName << ":" << location->lineNumber << ":"
      << location->columnNumber;

    if (location->symbolNameIndex) {
      auto symbolName =
        currModule->debugInfoSymbolNames[*(location->symbolNameIndex)];
      o << ":" << symbolName;
    }

    o << '\n';
  }
  doIndent(o, indent);
}